

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

uint llvm::APInt::tcLSB(WordType *parts,uint n)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  
  if (n != 0) {
    lVar3 = 0;
    do {
      uVar1 = *parts;
      if (uVar1 != 0) {
        lVar2 = 0;
        if (uVar1 != 0) {
          for (; (uVar1 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
          }
        }
        return (int)lVar2 - (int)lVar3;
      }
      lVar3 = lVar3 + -0x40;
      parts = parts + 1;
    } while ((ulong)n * 0x40 + lVar3 != 0);
  }
  return 0xffffffff;
}

Assistant:

unsigned APInt::tcLSB(const WordType *parts, unsigned n) {
  for (unsigned i = 0; i < n; i++) {
    if (parts[i] != 0) {
      unsigned lsb = partLSB(parts[i]);

      return lsb + i * APINT_BITS_PER_WORD;
    }
  }

  return -1U;
}